

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistanceEdgeTarget::VisitContainingShapes
          (S2MinDistanceEdgeTarget *this,S2ShapeIndex *index,ShapeVisitor *visitor)

{
  bool bVar1;
  BasicVector<Vector3,_double,_3UL> local_70 [24];
  D local_58;
  undefined1 local_40 [8];
  S2MinDistancePointTarget target;
  ShapeVisitor *visitor_local;
  S2ShapeIndex *index_local;
  S2MinDistanceEdgeTarget *this_local;
  
  target.point_.c_[2] = (VType)visitor;
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator+
            ((D *)local_70,(BasicVector<Vector3,_double,_3UL> *)&this->a_,&this->b_);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize(&local_58,local_70);
  S2MinDistancePointTarget::S2MinDistancePointTarget((S2MinDistancePointTarget *)local_40,&local_58)
  ;
  bVar1 = S2MinDistancePointTarget::VisitContainingShapes
                    ((S2MinDistancePointTarget *)local_40,index,(ShapeVisitor *)target.point_.c_[2])
  ;
  S2MinDistancePointTarget::~S2MinDistancePointTarget((S2MinDistancePointTarget *)local_40);
  return bVar1;
}

Assistant:

bool S2MinDistanceEdgeTarget::VisitContainingShapes(
    const S2ShapeIndex& index, const ShapeVisitor& visitor) {
  // We test the center of the edge in order to ensure that edge targets AB
  // and BA yield identical results (which is not guaranteed by the API but
  // users might expect).  Other options would be to test both endpoints, or
  // return different results for AB and BA in some cases.
  S2MinDistancePointTarget target((a_ + b_).Normalize());
  return target.VisitContainingShapes(index, visitor);
}